

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O3

void __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyTests::initPrograms
          (FilteringAnisotropyTests *this,SourceCollections *programCollection)

{
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *in_RCX;
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> programs;
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> local_28;
  Program local_c;
  
  local_28.
  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c = PROGRAM_2D_FLOAT;
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
  _M_realloc_insert<vkt::texture::util::Program>(&local_28,(iterator)0x0,&local_c);
  util::initializePrograms
            ((util *)programCollection,(SourceCollections *)0x2,(Precision)&local_28,in_RCX);
  if (local_28.
      super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void			initPrograms				(SourceCollections&	programCollection) const
	{
		std::vector<util::Program>	programs;
		programs.push_back(util::PROGRAM_2D_FLOAT);
		initializePrograms(programCollection,glu::PRECISION_HIGHP, programs);
	}